

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O1

bool __thiscall zmq::ipc_listener_t::filter(ipc_listener_t *this,fd_t sock_)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  char *__s2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  passwd *ppVar5;
  group *pgVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  char **ppcVar10;
  char *__s1;
  _Self __tmp;
  bool bVar11;
  ucred cred;
  socklen_t size;
  int local_40;
  _Rb_tree_color local_3c;
  _Rb_tree_color local_38;
  socklen_t local_34;
  
  if (((*(size_t *)
         ((long)&(this->super_stream_listener_base_t).super_own_t.options.ipc_uid_accept_filters.
                 _M_t._M_impl.super__Rb_tree_header + 0x20) == 0) &&
      (*(size_t *)
        ((long)&(this->super_stream_listener_base_t).super_own_t.options.ipc_pid_accept_filters._M_t
                ._M_impl.super__Rb_tree_header + 0x20) == 0)) &&
     (*(size_t *)
       ((long)&(this->super_stream_listener_base_t).super_own_t.options.ipc_gid_accept_filters._M_t.
               _M_impl.super__Rb_tree_header + 0x20) == 0)) {
    return true;
  }
  local_34 = 0xc;
  iVar3 = getsockopt(sock_,1,0x11,&local_40,&local_34);
  if (iVar3 == 0) {
    p_Var1 = &(this->super_stream_listener_base_t).super_own_t.options.ipc_uid_accept_filters._M_t.
              _M_impl.super__Rb_tree_header._M_header;
    p_Var8 = p_Var1;
    for (p_Var9 = *(_Base_ptr *)
                   ((long)&(this->super_stream_listener_base_t).super_own_t.options.
                           ipc_uid_accept_filters._M_t._M_impl.super__Rb_tree_header + 8);
        p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[bVar11]) {
      bVar11 = p_Var9[1]._M_color < local_3c;
      if (!bVar11) {
        p_Var8 = p_Var9;
      }
    }
    p_Var9 = p_Var1;
    if ((p_Var8 != p_Var1) && (p_Var9 = p_Var8, local_3c < p_Var8[1]._M_color)) {
      p_Var9 = p_Var1;
    }
    if (p_Var9 != p_Var1) {
      return true;
    }
    p_Var2 = &(this->super_stream_listener_base_t).super_own_t.options.ipc_gid_accept_filters._M_t.
              _M_impl.super__Rb_tree_header._M_header;
    p_Var4 = p_Var2;
    for (p_Var7 = *(_Base_ptr *)
                   ((long)&(this->super_stream_listener_base_t).super_own_t.options.
                           ipc_gid_accept_filters._M_t._M_impl.super__Rb_tree_header + 8);
        p_Var7 != (_Rb_tree_node_base *)0x0; p_Var7 = (&p_Var7->_M_left)[bVar11]) {
      bVar11 = p_Var7[1]._M_color < local_38;
      if (!bVar11) {
        p_Var4 = p_Var7;
      }
    }
    p_Var7 = p_Var2;
    if ((p_Var4 != p_Var2) && (p_Var7 = p_Var4, local_38 < p_Var4[1]._M_color)) {
      p_Var7 = p_Var2;
    }
    if (p_Var7 != p_Var2) {
      return true;
    }
    p_Var1 = &(this->super_stream_listener_base_t).super_own_t.options.ipc_pid_accept_filters._M_t.
              _M_impl.super__Rb_tree_header._M_header;
    p_Var8 = p_Var1;
    for (p_Var9 = *(_Base_ptr *)
                   ((long)&(this->super_stream_listener_base_t).super_own_t.options.
                           ipc_pid_accept_filters._M_t._M_impl.super__Rb_tree_header + 8);
        p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < local_40]) {
      if (local_40 <= (int)p_Var9[1]._M_color) {
        p_Var8 = p_Var9;
      }
    }
    p_Var9 = p_Var1;
    if ((p_Var8 != p_Var1) && (p_Var9 = p_Var8, local_40 < (int)p_Var8[1]._M_color)) {
      p_Var9 = p_Var1;
    }
    if (p_Var9 != p_Var1) {
      return true;
    }
    ppVar5 = getpwuid(local_3c);
    if (ppVar5 != (passwd *)0x0) {
      p_Var7 = *(_Base_ptr *)
                ((long)&(this->super_stream_listener_base_t).super_own_t.options.
                        ipc_gid_accept_filters._M_t._M_impl.super__Rb_tree_header + 0x10);
      do {
        bVar11 = p_Var7 != p_Var2;
        if (!bVar11) {
          return bVar11;
        }
        pgVar6 = getgrgid(p_Var7[1]._M_color);
        if (pgVar6 != (group *)0x0) {
          ppcVar10 = pgVar6->gr_mem;
          __s1 = *ppcVar10;
          if (__s1 != (char *)0x0) {
            __s2 = ppVar5->pw_name;
            do {
              ppcVar10 = ppcVar10 + 1;
              iVar3 = strcmp(__s1,__s2);
              if (iVar3 == 0) {
                return bVar11;
              }
              __s1 = *ppcVar10;
            } while (__s1 != (char *)0x0);
          }
        }
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      } while( true );
    }
  }
  return false;
}

Assistant:

bool zmq::ipc_listener_t::filter (fd_t sock_)
{
    if (options.ipc_uid_accept_filters.empty ()
        && options.ipc_pid_accept_filters.empty ()
        && options.ipc_gid_accept_filters.empty ())
        return true;

    struct ucred cred;
    socklen_t size = sizeof (cred);

    if (getsockopt (sock_, SOL_SOCKET, SO_PEERCRED, &cred, &size))
        return false;
    if (options.ipc_uid_accept_filters.find (cred.uid)
          != options.ipc_uid_accept_filters.end ()
        || options.ipc_gid_accept_filters.find (cred.gid)
             != options.ipc_gid_accept_filters.end ()
        || options.ipc_pid_accept_filters.find (cred.pid)
             != options.ipc_pid_accept_filters.end ())
        return true;

    const struct passwd *pw;
    const struct group *gr;

    if (!(pw = getpwuid (cred.uid)))
        return false;
    for (options_t::ipc_gid_accept_filters_t::const_iterator
           it = options.ipc_gid_accept_filters.begin (),
           end = options.ipc_gid_accept_filters.end ();
         it != end; it++) {
        if (!(gr = getgrgid (*it)))
            continue;
        for (char **mem = gr->gr_mem; *mem; mem++) {
            if (!strcmp (*mem, pw->pw_name))
                return true;
        }
    }
    return false;
}